

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O3

bool __thiscall libtorrent::settings_pack::has_val(settings_pack *this,int name)

{
  pointer ppVar1;
  difference_type __d;
  ulong uVar2;
  ulong uVar3;
  pointer ppVar4;
  pointer ppVar5;
  ushort uVar6;
  long lVar7;
  ulong uVar8;
  
  uVar6 = (ushort)name;
  switch((uint)name >> 0xe & 3) {
  case 0:
    ppVar4 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (this->m_strings).
             super__Vector_base<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar8 = (long)ppVar5 - (long)ppVar4;
    if (uVar8 == 0x208) {
      return true;
    }
    if (0 < (long)uVar8) {
      uVar8 = (uVar8 >> 3) * -0x3333333333333333;
      do {
        uVar2 = uVar8 >> 1;
        uVar3 = uVar2;
        if (ppVar4[uVar2].first < uVar6) {
          uVar3 = ~uVar2 + uVar8;
          ppVar4 = ppVar4 + uVar2 + 1;
        }
        uVar8 = uVar3;
      } while (0 < (long)uVar3);
    }
    break;
  case 1:
    ppVar1 = (pointer)(this->m_ints).
                      super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pointer)(this->m_ints).
                      super__Vector_base<std::pair<unsigned_short,_int>,_std::allocator<std::pair<unsigned_short,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)ppVar5 - (long)ppVar1;
    if (lVar7 == 0x4f8) {
      return true;
    }
    uVar8 = lVar7 >> 3;
    while (ppVar4 = ppVar1, 0 < (long)uVar8) {
      uVar3 = uVar8 >> 1;
      uVar8 = ~uVar3 + uVar8;
      ppVar1 = (pointer)(&ppVar4->first + uVar3 * 4 + 4);
      if (uVar6 <= (&ppVar4->first)[uVar3 * 4]) {
        ppVar1 = ppVar4;
        uVar8 = uVar3;
      }
    }
    break;
  case 2:
    ppVar1 = (pointer)(this->m_bools).
                      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pointer)(this->m_bools).
                      super__Vector_base<std::pair<unsigned_short,_bool>,_std::allocator<std::pair<unsigned_short,_bool>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    lVar7 = (long)ppVar5 - (long)ppVar1;
    if (lVar7 == 0x150) {
      return true;
    }
    uVar8 = lVar7 >> 2;
    while (ppVar4 = ppVar1, 0 < (long)uVar8) {
      uVar3 = uVar8 >> 1;
      uVar8 = ~uVar3 + uVar8;
      ppVar1 = (pointer)(&ppVar4->first + uVar3 * 2 + 2);
      if (uVar6 <= (&ppVar4->first)[uVar3 * 2]) {
        ppVar1 = ppVar4;
        uVar8 = uVar3;
      }
    }
    break;
  case 3:
    goto switchD_002f65aa_caseD_3;
  }
  if (ppVar4 != ppVar5) {
    return (uint)ppVar4->first == name;
  }
switchD_002f65aa_caseD_3:
  return false;
}

Assistant:

bool settings_pack::has_val(int const name) const
	{
		switch (name & type_mask)
		{
			case string_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_strings.size() == settings_pack::num_string_settings)
					return true;
				std::pair<std::uint16_t, std::string> v(aux::numeric_cast<std::uint16_t>(name), std::string());
				auto i = std::lower_bound(m_strings.begin(), m_strings.end(), v
						, &compare_first<std::string>);
				return i != m_strings.end() && i->first == name;
			}
			case int_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_ints.size() == settings_pack::num_int_settings)
					return true;
				std::pair<std::uint16_t, int> v(aux::numeric_cast<std::uint16_t>(name), 0);
				auto i = std::lower_bound(m_ints.begin(), m_ints.end(), v
						, &compare_first<int>);
				return i != m_ints.end() && i->first == name;
			}
			case bool_type_base:
			{
				// this is an optimization. If the settings pack is complete,
				// i.e. has every key, we don't need to search, it's just a lookup
				if (m_bools.size() == settings_pack::num_bool_settings)
					return true;
				std::pair<std::uint16_t, bool> v(aux::numeric_cast<std::uint16_t>(name), false);
				auto i = std::lower_bound(m_bools.begin(), m_bools.end(), v
						, &compare_first<bool>);
				return i != m_bools.end() && i->first == name;
			}
		}
		TORRENT_ASSERT_FAIL();
		return false;
	}